

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

bool __thiscall
QTest::TestMethods::invokeTest
          (TestMethods *this,int index,QLatin1StringView tag,optional<QTest::WatchDog> *watchDog)

{
  byte bVar1;
  Data *pDVar2;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QBenchmarkGlobalData *pQVar3;
  FILE *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QTestTable *this_00;
  QTestData *pQVar8;
  WatchDog *pWVar9;
  char *data;
  char *global;
  Data *pDVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  long in_FS_OFFSET;
  QAnyStringView QVar14;
  QArrayDataPointer<char16_t> local_308;
  QArrayDataPointer<char> local_2f0;
  QLatin1String local_2d8;
  QLatin1String local_2c8;
  QTestTable table;
  QArrayDataPointer<char> local_2b0;
  undefined1 local_298 [32];
  QTestDataSetter s;
  undefined7 uStack_277;
  char16_t *pcStack_270;
  qsizetype local_268;
  anon_class_16_2_3c5138a6 local_258;
  char member [512];
  anon_class_16_2_1223fae0 local_48;
  long local_38;
  
  pDVar10 = (Data *)tag.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_298._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_298._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_298._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBenchmarkTestMethodData::QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_298);
  QBenchmarkTestMethodData::current = (QBenchmarkTestMethodData *)local_298;
  std::vector<QMetaMethod,_std::allocator<QMetaMethod>_>::operator[](&this->m_methods,(long)index);
  QMetaMethod::name();
  member[0] = (undefined1)local_2b0.size;
  member[1] = local_2b0.size._1_1_;
  member[2] = local_2b0.size._2_1_;
  member[3] = local_2b0.size._3_1_;
  member[4] = local_2b0.size._4_1_;
  member[5] = local_2b0.size._5_1_;
  member[6] = local_2b0.size._6_1_;
  member[7] = local_2b0.size._7_1_;
  member._8_8_ = local_2b0.ptr;
  member[0x10] = '\x02';
  member[0x11] = '\0';
  member[0x12] = '\0';
  member[0x13] = '\0';
  member[0x14] = '\0';
  member[0x15] = '\0';
  member[0x16] = '\0';
  member[0x17] = '\0';
  member._24_8_ = (long)"sizeHintVariant.canConvert<QSize>()" + 0x21;
  QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>
            ((QString *)&s,(QStringBuilder<QLatin1String,_QLatin1String> *)member);
  pQVar3 = QBenchmarkGlobalData::current;
  pDVar2 = (QBenchmarkGlobalData::current->context).slotName.d.d;
  (QBenchmarkGlobalData::current->context).slotName.d.d = _s;
  (pQVar3->context).slotName.d.ptr = pcStack_270;
  (pQVar3->context).slotName.d.size = local_268;
  _s = pDVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&s);
  memset(member,0xaa,0x200);
  table.d = (QTestTablePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTestTable::QTestTable(&table);
  pcVar12 = local_2b0.ptr;
  if (local_2b0.ptr == (char *)0x0) {
    pcVar12 = (char *)&QByteArray::_empty;
  }
  QTestResult::setCurrentTestFunction(pcVar12);
  this_00 = QTestTable::globalTestTable();
  iVar6 = QTestTable::dataCount(this_00);
  local_258._12_4_ = 0xaaaaaaaa;
  local_258.globalDataCount = iVar6;
  bVar1 = 0;
  iVar13 = 0;
  local_258.gTable = this_00;
  do {
    bVar5 = QTestTable::isEmpty(this_00);
    if (!bVar5) {
      pQVar8 = QTestTable::testData(this_00,iVar13);
      QTestResult::setCurrentGlobalTestData(pQVar8);
    }
    if (iVar13 == 0) {
      pcVar12 = local_2b0.ptr;
      if (local_2b0.ptr == (char *)0x0) {
        pcVar12 = (char *)&QByteArray::_empty;
      }
      snprintf(member,0x200,"%s_data()",pcVar12);
      if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
          super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
          super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
        pWVar9 = std::
                 _Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                 ::_M_get((_Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                           *)watchDog);
        WatchDog::beginTest(pWVar9);
      }
      invokeTestMethodIfExists(member,currentTestObject);
      if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
          super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
          super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
        pWVar9 = std::
                 _Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                 ::_M_get((_Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                           *)watchDog);
        WatchDog::testFinished(pWVar9);
      }
      bVar5 = QTestResult::skipCurrentTest();
      if (bVar5) break;
    }
    iVar7 = QTestTable::dataCount(&table);
    local_48._12_4_ = 0xaaaaaaaa;
    local_48.dataCount = iVar7;
    iVar11 = 0;
    local_48.table = (QTestTable *)&table;
    do {
      QTestResult::setSkipCurrentTest(false);
      QTestResult::setBlacklistCurrentTest(false);
      pcVar12 = invokeTest::anon_class_16_2_1223fae0::operator()(&local_48,iVar11);
      QLatin1String::QLatin1String(&local_2c8,pcVar12);
      pcVar12 = invokeTest::anon_class_16_2_3c5138a6::operator()(&local_258,iVar13);
      QLatin1String::QLatin1String(&local_2d8,pcVar12);
      local_308.d = (Data *)local_2d8.m_size;
      local_308.ptr = (char16_t *)local_2d8.m_data;
      local_2f0.d = (Data *)local_2c8.m_size;
      local_2f0.ptr = local_2c8.m_data;
      _s = pDVar10;
      if ((((pDVar10 == (Data *)0x0) ||
           (bVar5 = comparesEqual((QLatin1StringView *)&s,(QLatin1StringView *)&local_2f0), bVar5))
          || (bVar5 = comparesEqual((QLatin1StringView *)&s,(QLatin1StringView *)&local_308), bVar5)
          ) || (((s_00.m_data = (char *)local_308.ptr, s_00.m_size = (qsizetype)local_308.d,
                 bVar5 = QLatin1String::startsWith((QLatin1String *)&s,s_00,CaseSensitive), bVar5 &&
                 (s_01.m_data = local_2f0.ptr, s_01.m_size = (qsizetype)local_2f0.d,
                 bVar5 = QLatin1String::endsWith((QLatin1String *)&s,s_01,CaseSensitive), bVar5)) &&
                ((_s == (Data *)((undefined1 *)
                                 ((long)&((local_2f0.d)->super_QArrayData).ref_._q_value.
                                         super___atomic_base<int>._M_i + 1) +
                                (long)&((local_308.d)->super_QArrayData).ref_) &&
                 (tag.m_data[(long)local_308.d] == ':')))))) {
        pcVar12 = local_2b0.ptr;
        if (local_2b0.ptr == (char *)0x0) {
          pcVar12 = (char *)&QByteArray::_empty;
        }
        data = invokeTest::anon_class_16_2_1223fae0::operator()(&local_48,iVar11);
        global = invokeTest::anon_class_16_2_3c5138a6::operator()(&local_258,iVar13);
        bVar5 = QTestPrivate::checkBlackLists(pcVar12,data,global);
        if ((bVar5) && (QTestResult::setBlacklistCurrentTest(true), skipBlacklisted == '\x01')) {
          qSkip("Skipping blacklisted test since -skipblacklisted option is set.",(char *)0x0,0);
          QTestResult::finishedCurrentTestData();
          QTestResult::finishedCurrentTestDataCleanup();
        }
        else {
          _s = (Data *)CONCAT71(uStack_277,0xaa);
          if (iVar11 < iVar7) {
            pQVar8 = QTestTable::testData(&table,iVar11);
          }
          else {
            pQVar8 = (QTestData *)0x0;
          }
          QTestResult::setCurrentTestData(pQVar8);
          QTestPrivate::qtestMouseButtons = 0;
          lastMouseTimestamp = lastMouseTimestamp + 500;
          if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
              super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
              super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
            pWVar9 = std::
                     _Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                     ::_M_get((_Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                               *)watchDog);
            WatchDog::beginTest(pWVar9);
          }
          invokeTestOnData(this,index);
          if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
              super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
              super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
            pWVar9 = std::
                     _Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                     ::_M_get((_Optional_base_impl<QTest::WatchDog,_std::_Optional_base<QTest::WatchDog,_false,_false>_>
                               *)watchDog);
            WatchDog::testFinished(pWVar9);
          }
          QTestDataSetter::~QTestDataSetter(&s);
        }
        bVar1 = 1;
        if (iVar6 == 0 && pDVar10 != (Data *)0x0) break;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar7);
    QTestResult::setCurrentGlobalTestData((QTestData *)0x0);
    iVar13 = iVar13 + 1;
  } while (iVar13 < iVar6);
  if (!(bool)(pDVar10 == (Data *)0x0 | bVar1)) {
    fprintf(_stderr,"Unknown testdata for function %s(): \'%s\'\n",local_2b0.ptr,tag.m_data);
    iVar6 = QTestTable::dataCount(&table);
    if (iVar6 != 0) {
      fputs("Available test-specific data tags:\n",_stderr);
      iVar13 = 0;
      if (0 < iVar6) {
        iVar13 = iVar6;
      }
      for (iVar7 = 0; pFVar4 = _stderr, iVar13 != iVar7; iVar7 = iVar7 + 1) {
        pQVar8 = QTestTable::testData(&table,iVar7);
        pcVar12 = QTestData::dataTag(pQVar8);
        fprintf(pFVar4,"\t%s\n",pcVar12);
      }
    }
    iVar13 = QTestTable::dataCount(this_00);
    if (iVar13 != 0) {
      fputs("Available global data tags:\n",_stderr);
      iVar7 = 0;
      if (0 < iVar13) {
        iVar7 = iVar13;
      }
      for (iVar11 = 0; pFVar4 = _stderr, iVar7 != iVar11; iVar11 = iVar11 + 1) {
        pQVar8 = QTestTable::testData(this_00,iVar11);
        pcVar12 = QTestData::dataTag(pQVar8);
        fprintf(pFVar4,"\t%s\n",pcVar12);
      }
    }
    if (iVar13 == 0 && iVar6 == 0) {
      fputs("Function has no data tags\n",_stderr);
    }
    _s = (Data *)CONCAT71(uStack_277,1);
    local_48.table = (QTestTable *)&s;
    local_48.dataCount = 0;
    local_48._12_4_ = 0;
    QVar14.m_size = (size_t)"Data tag not found: %1";
    QVar14.field_0.m_data = &local_308;
    QtPrivate::argToQString(QVar14,0x4000000000000016,(ArgBase **)0x1);
    QString::toLocal8Bit((QByteArray *)&local_2f0,(QString *)&local_308);
    pcVar12 = local_2f0.ptr;
    if (local_2f0.ptr == (char *)0x0) {
      pcVar12 = (char *)&QByteArray::_empty;
    }
    QTestResult::addFailure(pcVar12,(char *)0x0,0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_2f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
  }
  QTestResult::finishedCurrentTestFunction();
  QTestResult::setSkipCurrentTest(false);
  QTestResult::setBlacklistCurrentTest(false);
  QTestTable::~QTestTable(&table);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_2b0);
  QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_298);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool TestMethods::invokeTest(int index, QLatin1StringView tag, std::optional<WatchDog> &watchDog) const
{
    QBenchmarkTestMethodData benchmarkData;
    QBenchmarkTestMethodData::current = &benchmarkData;

    const QByteArray &name = m_methods[index].name();
    QBenchmarkGlobalData::current->context.slotName = QLatin1StringView(name) + "()"_L1;

    char member[512];
    QTestTable table;

    QTestResult::setCurrentTestFunction(name.constData());

    const QTestTable *gTable = QTestTable::globalTestTable();
    const int globalDataCount = gTable->dataCount();
    int curGlobalDataIndex = 0;
    const auto globalDataTag = [gTable, globalDataCount](int index) {
        return globalDataCount ? gTable->testData(index)->dataTag() : nullptr;
    };

    const auto dataTagMatches = [](QLatin1StringView tag, QLatin1StringView local,
                                   QLatin1StringView global) {
        if (tag.isEmpty()) // No tag specified => run all data sets for this function
            return true;
        if (tag == local || tag == global) // Equal to either => run it
            return true;
        // Also allow global:local as a match:
        return tag.startsWith(global) && tag.endsWith(local) &&
               tag.size() == global.size() + 1 + local.size() &&
               tag[global.size()] == ':';
    };
    bool foundFunction = false;
    bool blacklisted = false;

    /* For each entry in the global data table, do: */
    do {
        if (!gTable->isEmpty())
            QTestResult::setCurrentGlobalTestData(gTable->testData(curGlobalDataIndex));

        if (curGlobalDataIndex == 0) {
            std::snprintf(member, 512, "%s_data()", name.constData());
            runWithWatchdog(watchDog, [&member] {
                invokeTestMethodIfExists(member);
            });
            if (QTestResult::skipCurrentTest())
                break;
        }

        int curDataIndex = 0;
        const int dataCount = table.dataCount();
        const auto dataTag = [&table, dataCount](int index) {
            return dataCount ? table.testData(index)->dataTag() : nullptr;
        };

        /* For each entry in this test's data table, do: */
        do {
            QTestResult::setSkipCurrentTest(false);
            QTestResult::setBlacklistCurrentTest(false);
            if (dataTagMatches(tag, QLatin1StringView(dataTag(curDataIndex)),
                               QLatin1StringView(globalDataTag(curGlobalDataIndex)))) {
                foundFunction = true;
                blacklisted = QTestPrivate::checkBlackLists(name.constData(), dataTag(curDataIndex),
                                                            globalDataTag(curGlobalDataIndex));
                if (blacklisted)
                    QTestResult::setBlacklistCurrentTest(true);

                if (blacklisted && skipBlacklisted) {
                    QTest::qSkip("Skipping blacklisted test since -skipblacklisted option is set.",
                                  NULL, 0);
                    QTestResult::finishedCurrentTestData();
                    QTestResult::finishedCurrentTestDataCleanup();
                } else {
                    QTestDataSetter s(
                        curDataIndex >= dataCount ? nullptr : table.testData(curDataIndex));

                    QTestPrivate::qtestMouseButtons = Qt::NoButton;

                    // Maintain at least 500ms mouse event timestamps between each test function
                    // call
                    QTest::lastMouseTimestamp += 500;

                    runWithWatchdog(watchDog, [this, index] {
                        invokeTestOnData(index);
                    });
                }

                if (!tag.isEmpty() && !globalDataCount)
                    break;
            }
            ++curDataIndex;
        } while (curDataIndex < dataCount);

        QTestResult::setCurrentGlobalTestData(nullptr);
        ++curGlobalDataIndex;
    } while (curGlobalDataIndex < globalDataCount);

    if (!tag.isEmpty() && !foundFunction) {
        printUnknownDataTagError(QLatin1StringView(name), tag, table, *gTable);
        QTestResult::addFailure(qPrintable("Data tag not found: %1"_L1.arg(tag)));
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);

    return true;
}